

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall
Renderer::Render(Renderer *this,vector<Obstacle,_std::allocator<Obstacle>_> *obst,
                vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *carObjects)

{
  pointer pOVar1;
  __shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Obstacle *m;
  pointer this_00;
  __shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  SDL_Rect block;
  shared_ptr<Car> c;
  
  block.h = (int)(this->screen_height / this->grid_height);
  block.w = (int)(this->screen_width / this->grid_width);
  SDL_SetRenderDrawColor(this->sdl_renderer,0x1e,0x1e,0x1e,0xff);
  SDL_RenderClear(this->sdl_renderer);
  SDL_RenderCopy(this->sdl_renderer,this->tex,0);
  SDL_RenderPresent(this->sdl_renderer);
  if (this->endbmp == (SDL_Surface *)0x0) {
    std::operator<<((ostream *)&std::cout,"error rendering the flag");
  }
  SDL_SetRenderDrawColor(this->sdl_renderer,0xcc,0xff,0xcc,0xff);
  pOVar1 = (obst->super__Vector_base<Obstacle,_std::allocator<Obstacle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (obst->super__Vector_base<Obstacle,_std::allocator<Obstacle>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pOVar1; this_00 = this_00 + 1) {
    block.x = Obstacle::get_xpos(this_00);
    block.y = Obstacle::get_ypos(this_00);
    SDL_RenderFillRect(this->sdl_renderer,&block);
  }
  p_Var2 = &((carObjects->
             super__Vector_base<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>).
             _M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var3 = &((carObjects->
                  super__Vector_base<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>).
                  _M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>; p_Var3 != p_Var2;
      p_Var3 = p_Var3 + 1) {
    std::__shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&c.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
    block.x = Car::get_xpos(c.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    block.y = Car::get_ypos(c.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    block.w = 0x28;
    block.h = 0x28;
    SDL_RenderCopy(this->sdl_renderer,this->texCar,0,&block);
    SDL_RenderPresent(this->sdl_renderer);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  SDL_RenderPresent(this->sdl_renderer);
  return;
}

Assistant:

void Renderer::Render( std::vector<Obstacle>& obst, std::vector<std::shared_ptr<Car>> carObjects) {
  SDL_Rect block;
  block.w = screen_width / grid_width;
  block.h = screen_height / grid_height;

  // Clear screen
  SDL_SetRenderDrawColor(sdl_renderer, 0x1E, 0x1E, 0x1E, 0xFF);
  SDL_RenderClear(sdl_renderer);

  SDL_Rect texRect;// hold the flag image
  texRect.x = 0;
  texRect.y = 0;
  texRect.w = 50;
  texRect.h = 50;

  //render the flag
  SDL_RenderCopy(sdl_renderer,tex,NULL, &texRect);
  SDL_RenderPresent(sdl_renderer);
  if(endbmp == NULL)std::cout<<"error rendering the flag";

 


  //render obstacles
  SDL_SetRenderDrawColor(sdl_renderer, 0xCC, 0xFF, 0xCC, 0xFF);
  for ( auto& m : obst){
    //std::cout << m <<std::endl;
    block.x = m.get_xpos();
    block.y = m.get_ypos();
    SDL_RenderFillRect(sdl_renderer, &block);
  }


  //render cars
  //SDL_SetRenderDrawColor(sdl_renderer, 0x99, 0x00, 0xFF, 0xFF);
  for ( auto c : carObjects){
    //std::cout << "car location =" <<c->get_xpos();
    block.x = c->get_xpos();
    block.y = c->get_ypos();
    //SDL_RenderFillRect(sdl_renderer, &block);

    block.h = 40;
    block.w = 40;
    SDL_RenderCopy(sdl_renderer,texCar,NULL, &block);
    SDL_RenderPresent(sdl_renderer);

  }


  // Update Screen
  SDL_RenderPresent(sdl_renderer);
}